

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_3_4::ThreadPool::Data::setProvider(Data *this,ProviderPtr *provider)

{
  ProviderPtr curp;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> local_38;
  __shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             &provider->
              super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>);
  std::atomic_exchange<IlmThread_3_4::ThreadPoolProvider>(&local_38,&this->_provider);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  if ((local_38.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr != (element_type *)0x0) &&
     (local_38.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (provider->
                super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)) {
    (*(local_38.super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_vptr_ThreadPoolProvider[5])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void setProvider (ProviderPtr provider)
    {
        ProviderPtr curp = std::atomic_exchange (&_provider, provider);
        if (curp && curp != provider) curp->finish ();
    }